

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

char * os_basename(char *path,Path *p)

{
  Path *pPVar1;
  size_t sVar2;
  
  p->cstr[0] = '\0';
  strncpy(p->cstr,path,0x1000);
  pPVar1 = (Path *)__xpg_basename(p->cstr);
  if (p <= pPVar1) {
    sVar2 = strlen(p->cstr);
    if (pPVar1 < p->cstr + sVar2) {
      return pPVar1->cstr;
    }
  }
  __assert_fail("c >= p->cstr && c < p->cstr + strlen(p->cstr)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/os.c"
                ,0x12f,"char *os_basename(const char *, Path *)");
}

Assistant:

char *os_basename(const char *path, Path *p) {
#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) ||      \
    defined(__NetBSD__) || defined(__DragonFly__)
    p->cstr[0] = 0;
    strncpy(p->cstr, path, ARRAY_LEN(p->cstr));
    char *c = basename(p->cstr);
    assert(c >= p->cstr && c < p->cstr + strlen(p->cstr));
    return c;
#elif __APPLE__
#error "TODO os_basename for APPLE platform"
#else
#error "TODO os_basename for WINDOWS platform"
#endif
}